

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

int __thiscall CPU::instrLDX0xb6(CPU *this)

{
  uint8_t argument;
  
  argument = zeropage_y_addr(this);
  LDX(this,argument);
  return 4;
}

Assistant:

int CPU::instrLDX0xb6() {
	LDX(zeropage_y_addr());
	return 4;
}